

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_PairwiseExprPrecedence_Test::TestBody
          (ExprWriterTest_PairwiseExprPrecedence_Test *this)

{
  ExprFactory *this_00;
  ExprBase lhs;
  NumericConstant rhs;
  PairwiseExpr condition;
  char *message;
  AssertHelper local_b0;
  AssertionResult gtest_ar;
  string local_98;
  ArrayRef<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_78;
  NumericExpr args [2];
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory;
  lhs.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.0);
  rhs = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,1.0);
  args[0].super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,ADD,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)lhs.impl_,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                  rhs.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_);
  args[1].super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)25,(mp::expr::Kind)38>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,ADD,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)lhs.impl_,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                  rhs.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.impl_);
  local_78.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.save_.
  super__Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.size_ = 2;
  local_78.data_ = args;
  condition = ExprWriterTest::MakePairwise(&this->super_ExprWriterTest,ALLDIFF,&local_78);
  local_b0.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  condition.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.
                  impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                        rhs.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                        impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)lhs.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_98,(fmt *)0x14e4d3,(CStringRef)&local_b0,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)lhs.impl_);
  testing::internal::CmpHelperEQ<char[32],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"if alldiff(0 + 1, 0 + 1) then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakePairwise(ex::ALLDIFF, args), n1, n0)))"
             ,(char (*) [32])"if alldiff(0 + 1, 0 + 1) then 1",&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::
  _Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
  ::~_Vector_base((_Vector_base<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_std::allocator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>_>
                   *)&local_78);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x2fa,message);
    testing::internal::AssertHelper::operator=(&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprWriterTest, PairwiseExprPrecedence) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  NumericExpr args[] = {
    MakeBinary(ex::ADD, n0, n1), MakeBinary(ex::ADD, n0, n1)
  };
  CHECK_WRITE("if alldiff(0 + 1, 0 + 1) then 1",
      MakeIf(MakePairwise(ex::ALLDIFF, args), n1, n0));
}